

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O0

void test_list_iterate(void)

{
  int iVar1;
  LIST_NODE *pLVar2;
  LIST_NODE *pLVar3;
  int n;
  DATA *data;
  LIST_NODE *node;
  LIST list;
  LIST_NODE *in_stack_ffffffffffffffc8;
  LIST *in_stack_ffffffffffffffd0;
  int local_24;
  LIST_NODE *local_18;
  LIST local_10;
  
  list_init(&local_10);
  alloc_data((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  list_append(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  alloc_data((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  list_append(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  alloc_data((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  list_append(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_18 = list_head(&local_10);
  local_24 = 1;
  while( true ) {
    pLVar3 = local_18;
    pLVar2 = list_end(&local_10);
    if (pLVar3 == pLVar2) break;
    acutest_check_((int)(ulong)(*(int *)&local_18[-1].n == local_24),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x51,"%s","data->value == n");
    local_18 = list_next(local_18);
    local_24 = local_24 + 1;
  }
  local_18 = list_tail(&local_10);
  local_24 = 3;
  while( true ) {
    pLVar3 = local_18;
    pLVar2 = list_end(&local_10);
    if (pLVar3 == pLVar2) break;
    acutest_check_((int)(ulong)(*(int *)&local_18[-1].n == local_24),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x57,"%s","data->value == n");
    local_18 = list_prev(local_18);
    local_24 = local_24 + -1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = list_is_empty(&local_10);
    if (iVar1 != 0) break;
    pLVar3 = list_head(&local_10);
    list_remove(&local_10,pLVar3);
    free(&pLVar3[-1].n);
    local_24 = local_24 + 1;
  }
  acutest_check_((int)(ulong)(local_24 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x62,"%s","n == 3");
  return;
}

Assistant:

static void
test_list_iterate(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(1)->list_node);
    list_append(&list, &alloc_data(2)->list_node);
    list_append(&list, &alloc_data(3)->list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 3; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}